

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

void Nwk_ManDfsReverse_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  Tim_Man_t *p;
  int iVar1;
  int i;
  int iVar2;
  Nwk_Obj_t *pObj_00;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = pObj->pMan->nTravIds;
  if (pObj->TravId == iVar1) {
    return;
  }
  pObj->TravId = iVar1;
  uVar3 = *(uint *)&pObj->field_0x20 & 7;
  if ((uVar3 == 1) || (uVar3 == 3)) {
    for (lVar4 = 0;
        ((int)lVar4 < pObj->nFanouts && (pObj->pFanio[pObj->nFanins + lVar4] != (Nwk_Obj_t *)0x0));
        lVar4 = lVar4 + 1) {
      Nwk_ManDfsReverse_rec(pObj->pFanio[pObj->nFanins + lVar4],vNodes);
    }
  }
  else {
    if (uVar3 != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                    ,0x1b4,"void Nwk_ManDfsReverse_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
    }
    p = pObj->pMan->pManTime;
    if (p != (Tim_Man_t *)0x0) {
      iVar1 = Tim_ManBoxForCo(p,*(uint *)&pObj->field_0x20 >> 7);
      if (-1 < iVar1) {
        i = Tim_ManBoxOutputFirst(pObj->pMan->pManTime,iVar1);
        iVar2 = Tim_ManBoxOutputNum(pObj->pMan->pManTime,iVar1);
        iVar1 = 0;
        if (0 < iVar2) {
          iVar1 = iVar2;
        }
        while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
          pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(pObj->pMan->vCis,i);
          Nwk_ManDfsReverse_rec(pObj_00,vNodes);
          i = i + 1;
        }
      }
    }
  }
  Vec_PtrPush(vNodes,pObj);
  return;
}

Assistant:

void Nwk_ManDfsReverse_rec( Nwk_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjIsCo(pObj) )
    {
        if ( pObj->pMan->pManTime )
        {
            iBox = Tim_ManBoxForCo( pObj->pMan->pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this is not a true PO
            {
                iTerm1 = Tim_ManBoxOutputFirst( pObj->pMan->pManTime, iBox );
                nTerms = Tim_ManBoxOutputNum( pObj->pMan->pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Nwk_ManCi(pObj->pMan, iTerm1 + i);
                    Nwk_ManDfsReverse_rec( pNext, vNodes );
                }
            }
        }
    }
    else if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) )
    {
        Nwk_ObjForEachFanout( pObj, pNext, i )
            Nwk_ManDfsReverse_rec( pNext, vNodes );
    }
    else
        assert( 0 );
    Vec_PtrPush( vNodes, pObj );
}